

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O0

int main(void)

{
  void *pvVar1;
  Compound *pCVar2;
  Clause *pCVar3;
  Goal *pGVar4;
  pointer pcVar5;
  Program *pPVar6;
  Program *pPVar7;
  VarMapping *this;
  VarMapping *var_name_map;
  string names [2];
  Variable *vars [2];
  Program *prog_2;
  Program *prog_1;
  Goal *goal;
  Compound *app_i_j_123;
  Variable *var_j;
  Variable *var_i;
  Clause *clause_2;
  Compound *app_xl_m_xn;
  Compound *app_l_m_n;
  Variable *var_n;
  Variable *var_m;
  Variable *var_l;
  Clause *clause_1;
  Compound *app_nil_x_x;
  Variable *var_x;
  Compound *i_3;
  Compound *i_2;
  Compound *i_1;
  Compound *nil;
  Atom *atom_cons;
  Atom *atom_app;
  string *in_stack_fffffffffffffb98;
  Compound *in_stack_fffffffffffffba0;
  Atom *in_stack_fffffffffffffba8;
  Compound *in_stack_fffffffffffffbb0;
  string *psVar8;
  Atom *in_stack_fffffffffffffbb8;
  Compound *in_stack_fffffffffffffbc0;
  VarMapping *in_stack_fffffffffffffbc8;
  string *psVar9;
  allocator<char> *in_stack_fffffffffffffbd0;
  int level;
  char *in_stack_fffffffffffffbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_212;
  allocator<char> local_211;
  string *local_210;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  Program *local_1a8;
  Goal *local_1a0;
  Compound *local_198;
  void *local_190;
  pointer local_188;
  Clause *local_180;
  Compound *local_178;
  Compound *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  Clause *local_150;
  Compound *local_148;
  void *local_140;
  undefined1 local_133;
  undefined1 local_132;
  allocator<char> local_131 [33];
  void *local_110;
  undefined1 local_103;
  undefined1 local_102;
  allocator<char> local_101 [33];
  void *local_e0;
  undefined1 local_d3;
  undefined1 local_d2;
  allocator<char> local_d1 [33];
  void *local_b0;
  undefined1 local_a3;
  undefined1 local_a2;
  allocator<char> local_a1 [33];
  void *local_80;
  undefined1 local_72;
  allocator<char> local_71 [33];
  void *local_50;
  undefined1 local_45;
  allocator<char> local_31 [33];
  void *local_10;
  int local_4;
  
  local_4 = 0;
  pvVar1 = operator_new(0x20);
  local_45 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Atom::Atom((Atom *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_45 = 0;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0);
  std::allocator<char>::~allocator(local_31);
  local_10 = pvVar1;
  pvVar1 = operator_new(0x20);
  local_72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Atom::Atom((Atom *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_72 = 0;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0);
  std::allocator<char>::~allocator(local_71);
  local_50 = pvVar1;
  pvVar1 = operator_new(0x20);
  local_a3 = 1;
  operator_new(0x20);
  local_a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Atom::Atom((Atom *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_a2 = 0;
  Compound::Compound(in_stack_fffffffffffffba0,(Atom *)in_stack_fffffffffffffb98);
  local_a3 = 0;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0);
  std::allocator<char>::~allocator(local_a1);
  local_80 = pvVar1;
  pvVar1 = operator_new(0x20);
  local_d3 = 1;
  operator_new(0x20);
  local_d2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Atom::Atom((Atom *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_d2 = 0;
  Compound::Compound(in_stack_fffffffffffffba0,(Atom *)in_stack_fffffffffffffb98);
  local_d3 = 0;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0);
  std::allocator<char>::~allocator(local_d1);
  local_b0 = pvVar1;
  pvVar1 = operator_new(0x20);
  local_103 = 1;
  operator_new(0x20);
  local_102 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Atom::Atom((Atom *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_102 = 0;
  Compound::Compound(in_stack_fffffffffffffba0,(Atom *)in_stack_fffffffffffffb98);
  local_103 = 0;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0);
  std::allocator<char>::~allocator(local_101);
  local_e0 = pvVar1;
  pvVar1 = operator_new(0x20);
  local_133 = 1;
  operator_new(0x20);
  local_132 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  Atom::Atom((Atom *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  local_132 = 0;
  Compound::Compound(in_stack_fffffffffffffba0,(Atom *)in_stack_fffffffffffffb98);
  local_133 = 0;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffba0);
  std::allocator<char>::~allocator(local_131);
  local_110 = pvVar1;
  pvVar1 = operator_new(0x18);
  Variable::Variable((Variable *)in_stack_fffffffffffffba0);
  local_140 = pvVar1;
  pCVar2 = (Compound *)operator_new(0x20);
  Compound::Compound(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                     &in_stack_fffffffffffffbb0->super_Term,(Term *)in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term);
  local_148 = pCVar2;
  pCVar3 = (Clause *)operator_new(0x10);
  Clause::Clause(pCVar3,local_148,(Goal *)0x0);
  local_150 = pCVar3;
  pvVar1 = operator_new(0x18);
  Variable::Variable((Variable *)in_stack_fffffffffffffba0);
  local_158 = pvVar1;
  pvVar1 = operator_new(0x18);
  Variable::Variable((Variable *)in_stack_fffffffffffffba0);
  local_160 = pvVar1;
  pvVar1 = operator_new(0x18);
  Variable::Variable((Variable *)in_stack_fffffffffffffba0);
  local_168 = pvVar1;
  pCVar2 = (Compound *)operator_new(0x20);
  Compound::Compound(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                     &in_stack_fffffffffffffbb0->super_Term,(Term *)in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term);
  local_170 = pCVar2;
  pCVar2 = (Compound *)operator_new(0x20);
  operator_new(0x20);
  Compound::Compound(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term,(Term *)in_stack_fffffffffffffb98);
  operator_new(0x20);
  Compound::Compound(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term,(Term *)in_stack_fffffffffffffb98);
  Compound::Compound(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                     &in_stack_fffffffffffffbb0->super_Term,(Term *)in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term);
  local_178 = pCVar2;
  pCVar3 = (Clause *)operator_new(0x10);
  pCVar2 = local_178;
  pGVar4 = (Goal *)operator_new(0x10);
  Goal::Goal(pGVar4,local_170,(Goal *)0x0);
  Clause::Clause(pCVar3,pCVar2,pGVar4);
  local_180 = pCVar3;
  pcVar5 = (pointer)operator_new(0x18);
  Variable::Variable((Variable *)in_stack_fffffffffffffba0);
  local_188 = pcVar5;
  pvVar1 = operator_new(0x18);
  Variable::Variable((Variable *)in_stack_fffffffffffffba0);
  local_190 = pvVar1;
  pCVar2 = (Compound *)operator_new(0x20);
  operator_new(0x20);
  operator_new(0x20);
  operator_new(0x20);
  Compound::Compound(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term,(Term *)in_stack_fffffffffffffb98);
  Compound::Compound(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term,(Term *)in_stack_fffffffffffffb98);
  Compound::Compound(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term,(Term *)in_stack_fffffffffffffb98);
  Compound::Compound(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                     &in_stack_fffffffffffffbb0->super_Term,(Term *)in_stack_fffffffffffffba8,
                     &in_stack_fffffffffffffba0->super_Term);
  local_198 = pCVar2;
  pGVar4 = (Goal *)operator_new(0x10);
  Goal::Goal(pGVar4,local_198,(Goal *)0x0);
  local_1a0 = pGVar4;
  pPVar6 = (Program *)operator_new(0x10);
  pCVar3 = local_150;
  pPVar7 = (Program *)operator_new(0x10);
  Program::Program(pPVar7,local_180,(Program *)0x0);
  Program::Program(pPVar6,pCVar3,pPVar7);
  local_1a8 = pPVar6;
  pPVar6 = (Program *)operator_new(0x10);
  pCVar3 = local_180;
  pPVar7 = (Program *)operator_new(0x10);
  Program::Program(pPVar7,local_150,(Program *)0x0);
  Program::Program(pPVar6,pCVar3,pPVar7);
  local_1c8._M_dataplus._M_p = local_188;
  local_1c8._M_string_length = (size_type)local_190;
  local_210 = &local_208;
  local_1c8.field_2._8_8_ = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  this_00 = &local_1e8;
  local_210 = this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  level = (int)((ulong)in_stack_fffffffffffffbd0 >> 0x20);
  std::allocator<char>::~allocator(&local_212);
  std::allocator<char>::~allocator(&local_211);
  this = (VarMapping *)operator_new(0x18);
  VarMapping::VarMapping(this,(Variable **)&local_1c8,&local_208,2);
  std::operator<<((ostream *)&std::cout,"=== Normal clause order:\n");
  Goal::solve((Goal *)this_00,(Program *)this,level,in_stack_fffffffffffffbc8);
  std::operator<<((ostream *)&std::cout,"\n=== Reversed clause order:\n");
  Goal::solve((Goal *)this_00,(Program *)this,level,in_stack_fffffffffffffbc8);
  local_4 = 0;
  psVar9 = &local_208;
  psVar8 = &local_1c8;
  do {
    psVar8 = psVar8 + -1;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffba0);
  } while (psVar8 != psVar9);
  return local_4;
}

Assistant:

int main()
{
    auto *atom_app = new Atom("app");
    auto *atom_cons = new Atom("cons");
    auto *nil = new Compound(new Atom("nil"));
    auto *i_1 = new Compound(new Atom("1"));
    auto *i_2 = new Compound(new Atom("2"));
    auto *i_3 = new Compound(new Atom("3"));

    //
    // Clause 1:
    //      app(nil, x, x)
    //
    auto *var_x = new Variable();
    auto *app_nil_x_x = new Compound(atom_app, nil, var_x, var_x);
    auto *clause_1 = new Clause(app_nil_x_x);

    //
    // Clause 2:
    //      app([x|l], m, [x|n]); app(l, m, n)
    //
    auto *var_l = new Variable();
    auto *var_m = new Variable();
    auto *var_n = new Variable();
    auto *app_l_m_n = new Compound(atom_app, var_l, var_m, var_n);
    auto *app_xl_m_xn = new Compound(atom_app, new Compound(atom_cons, var_x, var_l),
                                     var_m, new Compound(atom_cons, var_x, var_n));
    auto *clause_2 = new Clause(app_xl_m_xn, new Goal(app_l_m_n));

    //
    // Goal:
    //      app(i, j, [1, 2, 3])
    auto *var_i = new Variable();
    auto *var_j = new Variable();
    auto *app_i_j_123 = new Compound(atom_app, var_i, var_j,
                                     new Compound(atom_cons, i_1,
                                           new Compound(atom_cons, i_2,
                                                        new Compound(atom_cons, i_3, nil))));
    auto *goal = new Goal(app_i_j_123);

    //
    // Two test programs.
    //
    auto *prog_1 = new Program(clause_1, new Program(clause_2));
    auto *prog_2 = new Program(clause_2, new Program(clause_1));

    //
    // Two variables in the goal: I and J.
    //
    Variable *vars[] = { var_i, var_j };
    std::string names[] = { "I", "J" };
    auto *var_name_map = new VarMapping(vars, names, 2);

    //
    // Run program 1.
    //
    std::cout << "=== Normal clause order:\n";
    goal->solve(prog_1, 0, var_name_map);

    //
    // Run program 2.
    //
    std::cout << "\n=== Reversed clause order:\n";
    goal->solve(prog_2, 0, var_name_map);
    return 0;
}